

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_read_file_to_buffer
               (char *filename,uint64_t maxsize,int require_text,uint64_t *user_result_size,
               char **user_result_buf)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  mcpl_buffer_t out;
  mcpl_generic_filehandle_t file;
  mcpl_buffer_t local_70;
  uint64_t *local_58;
  char **local_50;
  mcpl_generic_filehandle_t local_48;
  
  uVar6 = -(ulong)(maxsize == 0) | maxsize;
  local_58 = user_result_size;
  local_50 = user_result_buf;
  mcpl_generic_fopen(&local_48,filename);
  sVar4 = 0x10000;
  if (uVar6 < 0x10000) {
    sVar4 = uVar6;
  }
  mcpl_internal_buf_create(&local_70,sVar4);
  sVar4 = local_70.capacity;
  do {
    if (0x100 < (uint)(sVar4 >> 0x20)) {
      mcpl_error("mcpl_read_file_to_buffer trying to load more than 1TB");
    }
    uVar5 = sVar4 - local_70.size;
    if (uVar5 < 0x7fffffff) {
      uVar5 = sVar4 * 2;
      if (uVar6 <= sVar4 * 2) {
        uVar5 = uVar6;
      }
      mcpl_internal_buf_reserve(&local_70,uVar5);
      uVar5 = local_70.capacity - local_70.size;
      sVar4 = local_70.capacity;
    }
    sVar1 = local_70.size;
    if (0x7ffffffe < uVar5) {
      uVar5 = 0x7fffffff;
    }
    uVar2 = mcpl_generic_fread_try(&local_48,local_70.buf + local_70.size,(uint)uVar5);
    local_70.size = uVar2 + sVar1;
  } while (((uint)uVar5 <= uVar2) && (local_70.size != uVar6));
  mcpl_generic_fclose(&local_48);
  if (require_text != 0) {
    iVar3 = mcpl_buf_is_text(&local_70);
    if (iVar3 == 0) {
      mcpl_error("File is not a text file");
    }
    mcpl_internal_normalise_eol(&local_70);
  }
  mcpl_internal_buf_squeeze(&local_70);
  *local_58 = local_70.size;
  *local_50 = local_70.buf;
  return;
}

Assistant:

void mcpl_read_file_to_buffer( const char * filename,
                               uint64_t maxsize,
                               int require_text,
                               uint64_t* user_result_size,
                               char ** user_result_buf )
{
  MCPL_STATIC_ASSERT( sizeof(size_t) >= sizeof(uint64_t) );

  if ( maxsize == 0 )
    maxsize = UINT64_MAX;

  mcpl_generic_filehandle_t file = mcpl_generic_fopen( filename );
  mcpl_buffer_t out = mcpl_internal_buf_create( 65536 > maxsize
                                                ? maxsize
                                                : 65536 );

  const unsigned max_at_a_time = INT32_MAX;

  while (1) {
    if ( out.capacity >= 1103806595072 )
      mcpl_error("mcpl_read_file_to_buffer trying to load more than 1TB");
    if ( out.capacity - out.size < max_at_a_time )
      mcpl_internal_buf_reserve( &out, ( out.capacity * 2 > (size_t)maxsize
                                         ? (size_t)maxsize
                                         : out.capacity*2) );
    size_t nread_max = out.capacity - out.size;
    unsigned max_in_this_go = ( nread_max > max_at_a_time
                                ? max_at_a_time
                                : (unsigned)nread_max );
    unsigned nread_actual = mcpl_generic_fread_try( &file,
                                                    out.buf + out.size,
                                                    max_in_this_go );
    out.size += nread_actual;
    if ( nread_actual < max_in_this_go || out.size == maxsize )
      break;//no more to read
  }

  mcpl_generic_fclose( &file );

  if ( require_text ) {
    if ( !mcpl_buf_is_text(&out) )
      mcpl_error("File is not a text file");
    mcpl_internal_normalise_eol(&out);
  }

  //Discard excess allocations:
  mcpl_internal_buf_squeeze( &out );

  //Done:
  *user_result_size = out.size;
  *user_result_buf = out.buf;
}